

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O1

void __thiscall
ot::commissioner::JoinerSession::RelaySocket::RelaySocket
          (RelaySocket *this,JoinerSession *aJoinerSession,Address *aPeerAddr,uint16_t aPeerPort,
          Address *aLocalAddr,uint16_t aLocalPort)

{
  event *ev;
  int iVar1;
  
  Socket::Socket(&this->super_Socket,aJoinerSession->mCommImpl->mEventBase);
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__RelaySocket_00279c08;
  this->mJoinerSession = aJoinerSession;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->mPeerAddr).mBytes,&aPeerAddr->mBytes);
  this->mPeerPort = aPeerPort;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->mLocalAddr).mBytes,&aLocalAddr->mBytes);
  this->mLocalPort = aLocalPort;
  (this->mRecvBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mRecvBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mRecvBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Socket).mIsConnected = true;
  ev = &(this->super_Socket).mEvent;
  iVar1 = event_assign(ev,(this->super_Socket).mEventBase,-1,0x10,Socket::HandleEvent,this);
  if (iVar1 == 0) {
    iVar1 = event_add(ev,(timeval *)0x0);
    if (iVar1 == 0) {
      return;
    }
  }
  abort();
}

Assistant:

JoinerSession::RelaySocket::RelaySocket(JoinerSession &aJoinerSession,
                                        const Address &aPeerAddr,
                                        uint16_t       aPeerPort,
                                        const Address &aLocalAddr,
                                        uint16_t       aLocalPort)
    : Socket(aJoinerSession.mCommImpl.GetEventBase())
    , mJoinerSession(aJoinerSession)
    , mPeerAddr(aPeerAddr)
    , mPeerPort(aPeerPort)
    , mLocalAddr(aLocalAddr)
    , mLocalPort(aLocalPort)
{
    int fail;

    mIsConnected = true;

    fail = event_assign(&mEvent, mEventBase, -1, EV_PERSIST, HandleEvent, this);
    VerifyOrDie(fail == 0);
    VerifyOrDie((fail = event_add(&mEvent, nullptr)) == 0);
}